

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O0

void __thiscall Assimp::LWOImporter::LoadLWO2VertexMap(LWOImporter *this,uint length,bool perPoly)

{
  uint idx_00;
  ReferrerList *pRVar1;
  undefined8 uVar2;
  uint numRead;
  bool bVar3;
  uint16_t uVar4;
  int iVar5;
  DeadlyImportError *this_00;
  long lVar6;
  Logger *pLVar7;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar8;
  basic_formatter *pbVar9;
  size_type sVar10;
  uint *puVar11;
  reference pvVar12;
  reference __x;
  float *__p;
  type pfVar13;
  pointer data;
  float fVar14;
  reference rVar15;
  WeightChannelList *local_870;
  uint local_824;
  uint l;
  unique_ptr<float[],_std::default_delete<float[]>_> temp;
  string local_6a0;
  value_type_conflict2 local_67c;
  uint local_678;
  uint local_674;
  uint tmp;
  uint srcIdx;
  uint i;
  bool had;
  Face *src;
  string local_4e8;
  reference local_4c8;
  uint local_4b4;
  undefined1 local_4b0 [4];
  uint polyIdx;
  string local_338;
  uint local_314;
  uint local_310;
  uint idx;
  uint numFaces;
  uint numPoints;
  ReferrerList *refList;
  PointList *pointList;
  FaceList *list;
  undefined1 local_2e8 [4];
  uint diff;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined4 local_cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  string name;
  VMapEntry *base;
  uint dims;
  uint type;
  allocator<char> local_41;
  string local_40;
  uint8_t *local_20;
  uint8_t *end;
  bool perPoly_local;
  LWOImporter *pLStack_10;
  uint length_local;
  LWOImporter *this_local;
  
  local_20 = this->mFileBuffer + length;
  end._3_1_ = perPoly;
  end._4_4_ = length;
  pLStack_10 = this;
  if (length < 6) {
    dims._3_1_ = 1;
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"LWO: VMAP chunk is too small",&local_41);
    DeadlyImportError::DeadlyImportError(this_00,&local_40);
    dims._3_1_ = 0;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  base._4_4_ = GetU4(this);
  uVar4 = GetU2(this);
  base._0_4_ = (uint)uVar4;
  std::__cxx11::string::string((string *)local_88);
  GetS0(this,(string *)local_88,end._4_4_);
  if (base._4_4_ == 0x4d4e5657) {
LAB_00530e89:
    if ((uint)base == 1) {
      if (base._4_4_ == 0x57474854) {
        local_870 = &this->mCurLayer->mWeightChannels;
      }
      else {
        local_870 = &this->mCurLayer->mSWeightChannels;
      }
      name.field_2._8_8_ =
           FindEntry<Assimp::LWO::WeightChannel>(local_870,(string *)local_88,(bool)(end._3_1_ & 1))
      ;
LAB_0053128d:
      uVar2 = name.field_2._8_8_;
      sVar10 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                         (&this->mCurLayer->mTempPoints);
      (**(code **)(*(long *)uVar2 + 0x10))(uVar2,sVar10 & 0xffffffff);
      puVar11 = std::min<unsigned_int>((uint *)&base,(uint *)(name.field_2._8_8_ + 0x28));
      base._4_4_ = *puVar11;
      list._4_4_ = ((uint)base - base._4_4_) * 4;
      pointList = (PointList *)&this->mCurLayer->mFaces;
      refList = (ReferrerList *)this->mCurLayer;
      _numFaces = &this->mCurLayer->mPointReferrers;
      sVar10 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)refList)
      ;
      idx = (uint)sVar10;
      sVar10 = std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>::size
                         ((vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_> *)pointList
                         );
      local_310 = (uint)sVar10;
LAB_00531354:
      do {
        if (local_20 <= this->mFileBuffer) goto LAB_00531ac7;
        iVar5 = ReadVSizedIntLWO2(this,&this->mFileBuffer);
        local_314 = iVar5 + this->mCurLayer->mPointIDXOfs;
        if (local_314 < idx) {
          if ((end._3_1_ & 1) != 0) {
            iVar5 = ReadVSizedIntLWO2(this,&this->mFileBuffer);
            local_4b4 = iVar5 + this->mCurLayer->mFaceIDXOfs;
            rVar15 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)(name.field_2._8_8_ + 0x48),
                                (ulong)local_314);
            local_4c8 = rVar15;
            bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_4c8);
            if (bVar3) {
              if (local_310 <= local_4b4) {
                pLVar7 = DefaultLogger::get();
                Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                basic_formatter<char[38]>
                          ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &src,(char (*) [38])"LWO2: Failure evaluating VMAD entry \'");
                pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         Formatter::
                         basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                         operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                    *)&src,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_88);
                pbVar9 = (basic_formatter *)
                         Formatter::
                         basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                         operator_(pbVar8,(char (*) [33])"\', polygon index is out of range");
                Formatter::basic_formatter::operator_cast_to_string(&local_4e8,pbVar9);
                Logger::warn(pLVar7,&local_4e8);
                std::__cxx11::string::~string((string *)&local_4e8);
                Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&src);
                this->mFileBuffer =
                     this->mFileBuffer + (uint)(*(int *)(name.field_2._8_8_ + 0x28) << 2);
                goto LAB_00531354;
              }
              _i = std::vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>::operator[]
                             ((vector<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_> *)
                              pointList,(ulong)local_4b4);
              srcIdx._3_1_ = 0;
              for (tmp = 0; tmp < (_i->super_aiFace).mNumIndices; tmp = tmp + 1) {
                local_674 = (_i->super_aiFace).mIndices[tmp];
                local_678 = local_314;
                do {
                  if (local_678 == local_674) break;
                  pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                      (_numFaces,(ulong)local_678);
                  local_678 = *pvVar12;
                } while (local_678 != 0xffffffff);
                pRVar1 = _numFaces;
                if (local_678 != 0xffffffff) {
                  srcIdx._3_1_ = 1;
                  sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(_numFaces)
                  ;
                  local_67c = 0xffffffff;
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                            (pRVar1,sVar10 + 1,&local_67c);
                  sVar10 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                                     ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                       *)refList);
                  local_314 = (uint)sVar10;
                  sVar10 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                                     ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                       *)refList);
                  (_i->super_aiFace).mIndices[tmp] = (uint)sVar10;
                  AddToSingleLinkedList(_numFaces,local_674,(_i->super_aiFace).mIndices[tmp]);
                  pRVar1 = refList;
                  __x = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                        operator[]((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *
                                   )refList,(ulong)local_674);
                  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             pRVar1,__x);
                  CreateNewEntry<Assimp::LWO::VColorChannel>
                            (&this->mCurLayer->mVColorChannels,local_674);
                  CreateNewEntry<Assimp::LWO::UVChannel>(&this->mCurLayer->mUVChannels,local_674);
                  CreateNewEntry<Assimp::LWO::WeightChannel>
                            (&this->mCurLayer->mWeightChannels,local_674);
                  CreateNewEntry<Assimp::LWO::WeightChannel>
                            (&this->mCurLayer->mSWeightChannels,local_674);
                  CreateNewEntry<Assimp::LWO::NormalChannel>(&this->mCurLayer->mNormals,local_674);
                }
              }
              if ((srcIdx._3_1_ & 1) == 0) {
                pLVar7 = DefaultLogger::get();
                Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                basic_formatter<char[38]>
                          ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &temp,(char (*) [38])"LWO2: Failure evaluating VMAD entry \'");
                pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         Formatter::
                         basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                         operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                    *)&temp,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_88);
                pbVar9 = (basic_formatter *)
                         Formatter::
                         basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                         operator_(pbVar8,(char (*) [45])
                                          "\', vertex index wasn\'t found in that polygon");
                Formatter::basic_formatter::operator_cast_to_string(&local_6a0,pbVar9);
                Logger::warn(pLVar7,&local_6a0);
                std::__cxx11::string::~string((string *)&local_6a0);
                Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&temp);
                if ((srcIdx._3_1_ & 1) == 0) {
                  __assert_fail("had",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/LWO/LWOLoader.cpp"
                                ,0x467,
                                "void Assimp::LWOImporter::LoadLWO2VertexMap(unsigned int, bool)");
                }
              }
            }
          }
          __p = (float *)operator_new__((ulong)base._4_4_ << 2);
          std::unique_ptr<float[],std::default_delete<float[]>>::
          unique_ptr<float*,std::default_delete<float[]>,void,bool>
                    ((unique_ptr<float[],std::default_delete<float[]>> *)&stack0xfffffffffffff7e0,
                     __p);
          for (local_824 = 0; numRead = base._4_4_, uVar2 = name.field_2._8_8_, idx_00 = local_314,
              local_824 < base._4_4_; local_824 = local_824 + 1) {
            fVar14 = GetF4(this);
            pfVar13 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                                ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                                 &stack0xfffffffffffff7e0,(ulong)local_824);
            *pfVar13 = fVar14;
          }
          data = std::unique_ptr<float[],_std::default_delete<float[]>_>::get
                           ((unique_ptr<float[],_std::default_delete<float[]>_> *)
                            &stack0xfffffffffffff7e0);
          DoRecursiveVMAPAssignment(this,(VMapEntry *)uVar2,numRead,idx_00,data);
          this->mFileBuffer = this->mFileBuffer + list._4_4_;
          std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
                    ((unique_ptr<float[],_std::default_delete<float[]>_> *)&stack0xfffffffffffff7e0)
          ;
          goto LAB_00531354;
        }
        pLVar7 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[43]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b0
                   ,(char (*) [43])"LWO2: Failure evaluating VMAP/VMAD entry \'");
        pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                           local_4b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88);
        pbVar9 = (basic_formatter *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator_(pbVar8,(char (*) [32])"\', vertex index is out of range");
        Formatter::basic_formatter::operator_cast_to_string(&local_338,pbVar9);
        Logger::warn(pLVar7,&local_338);
        std::__cxx11::string::~string((string *)&local_338);
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4b0);
        this->mFileBuffer = this->mFileBuffer + (uint)(*(int *)(name.field_2._8_8_ + 0x28) << 2);
      } while( true );
    }
    pLVar7 = DefaultLogger::get();
    std::operator+(&local_110,"LWO2: Skipping Weight Channel \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    std::operator+(&local_f0,&local_110,"\' with !1 components");
    Logger::warn(pLVar7,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    local_cc = 1;
  }
  else {
    if (base._4_4_ != 0x4d4f5246) {
      if (base._4_4_ == 0x4e4f524d) {
        bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_88,"vert_normals");
        if (((bVar3) || ((uint)base != 3)) || (lVar6 = std::__cxx11::string::length(), lVar6 != 0))
        {
          local_cc = 1;
          goto LAB_00531ad1;
        }
        pLVar7 = DefaultLogger::get();
        Logger::info(pLVar7,"Processing non-standard extension: MODO VMAP.NORM.vert_normals");
        std::__cxx11::string::operator=
                  ((string *)&(this->mCurLayer->mNormals).super_VMapEntry.name,(string *)local_88);
        name.field_2._8_8_ = &this->mCurLayer->mNormals;
        goto LAB_0053128d;
      }
      if (base._4_4_ != 0x5049434b) {
        if ((base._4_4_ == 0x52474220) || (base._4_4_ == 0x52474241)) {
          if (((uint)base == 3) || ((uint)base == 4)) {
            name.field_2._8_8_ =
                 FindEntry<Assimp::LWO::VColorChannel>
                           (&this->mCurLayer->mVColorChannels,(string *)local_88,
                            (bool)(end._3_1_ & 1));
            goto LAB_0053128d;
          }
          pLVar7 = DefaultLogger::get();
          std::operator+(&local_150,"LWO2: Skipping Color Map \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_88);
          std::operator+(&local_130,&local_150,"\' with a dimension > 4 or < 3");
          Logger::warn(pLVar7,&local_130);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&local_150);
          local_cc = 1;
          goto LAB_00531ad1;
        }
        if (base._4_4_ != 0x53504f54) {
          if (base._4_4_ == 0x54585556) {
            if ((uint)base == 2) {
              name.field_2._8_8_ =
                   FindEntry<Assimp::LWO::UVChannel>
                             (&this->mCurLayer->mUVChannels,(string *)local_88,(bool)(end._3_1_ & 1)
                             );
              goto LAB_0053128d;
            }
            pLVar7 = DefaultLogger::get();
            std::operator+(&local_c8,"LWO2: Skipping UV channel \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88);
            std::operator+(&local_a8,&local_c8,"\' with !2 components");
            Logger::warn(pLVar7,&local_a8);
            std::__cxx11::string::~string((string *)&local_a8);
            std::__cxx11::string::~string((string *)&local_c8);
            local_cc = 1;
            goto LAB_00531ad1;
          }
          if (base._4_4_ != 0x57474854) {
            std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_88,"APS.Level");
            pLVar7 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[43]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2e8,(char (*) [43])"LWO2: Skipping unknown VMAP/VMAD channel \'");
            pbVar8 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                     Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                     operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                               local_2e8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_88);
            pbVar9 = (basic_formatter *)
                     Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                     operator_(pbVar8,(char (*) [2])0xa925e8);
            Formatter::basic_formatter::operator_cast_to_string(&local_170,pbVar9);
            Logger::warn(pLVar7,&local_170);
            std::__cxx11::string::~string((string *)&local_170);
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *
                             )local_2e8);
            local_cc = 1;
            goto LAB_00531ad1;
          }
          goto LAB_00530e89;
        }
      }
    }
    local_cc = 1;
  }
LAB_00531ad1:
  std::__cxx11::string::~string((string *)local_88);
  return;
LAB_00531ac7:
  local_cc = 0;
  goto LAB_00531ad1;
}

Assistant:

void LWOImporter::LoadLWO2VertexMap(unsigned int length, bool perPoly)
{
    LE_NCONST uint8_t* const end = mFileBuffer+length;

    AI_LWO_VALIDATE_CHUNK_LENGTH(length,VMAP,6);
    unsigned int type = GetU4();
    unsigned int dims = GetU2();

    VMapEntry* base;

    // read the name of the vertex map
    std::string name;
    GetS0(name,length);

    switch (type)
    {
    case AI_LWO_TXUV:
        if (dims != 2)  {
            ASSIMP_LOG_WARN("LWO2: Skipping UV channel \'"
            + name + "\' with !2 components");
            return;
        }
        base = FindEntry(mCurLayer->mUVChannels,name,perPoly);
        break;
    case AI_LWO_WGHT:
    case AI_LWO_MNVW:
        if (dims != 1)  {
            ASSIMP_LOG_WARN("LWO2: Skipping Weight Channel \'"
            + name + "\' with !1 components");
            return;
        }
        base = FindEntry((type == AI_LWO_WGHT ? mCurLayer->mWeightChannels
            : mCurLayer->mSWeightChannels),name,perPoly);
        break;
    case AI_LWO_RGB:
    case AI_LWO_RGBA:
        if (dims != 3 && dims != 4) {
            ASSIMP_LOG_WARN("LWO2: Skipping Color Map \'"
            + name + "\' with a dimension > 4 or < 3");
            return;
        }
        base = FindEntry(mCurLayer->mVColorChannels,name,perPoly);
        break;

    case AI_LWO_MODO_NORM:
        /*  This is a non-standard extension chunk used by Luxology's MODO.
         *  It stores per-vertex normals. This VMAP exists just once, has
         *  3 dimensions and is btw extremely beautiful.
         */
        if (name != "vert_normals" || dims != 3 || mCurLayer->mNormals.name.length())
            return;

        ASSIMP_LOG_INFO("Processing non-standard extension: MODO VMAP.NORM.vert_normals");

        mCurLayer->mNormals.name = name;
        base = & mCurLayer->mNormals;
        break;

    case AI_LWO_PICK: /* these VMAPs are just silently dropped */
    case AI_LWO_MORF:
    case AI_LWO_SPOT:
        return;

    default:
        if (name == "APS.Level") {
            // XXX handle this (seems to be subdivision-related).
        }
        ASSIMP_LOG_WARN_F("LWO2: Skipping unknown VMAP/VMAD channel \'", name, "\'");
        return;
    };
    base->Allocate((unsigned int)mCurLayer->mTempPoints.size());

    // now read all entries in the map
    type = std::min(dims,base->dims);
    const unsigned int diff = (dims - type)<<2u;

    LWO::FaceList& list = mCurLayer->mFaces;
    LWO::PointList& pointList = mCurLayer->mTempPoints;
    LWO::ReferrerList& refList = mCurLayer->mPointReferrers;

    const unsigned int numPoints = (unsigned int)pointList.size();
    const unsigned int numFaces  = (unsigned int)list.size();

    while (mFileBuffer < end)   {

        unsigned int idx = ReadVSizedIntLWO2(mFileBuffer) + mCurLayer->mPointIDXOfs;
        if (idx >= numPoints)   {
            ASSIMP_LOG_WARN_F("LWO2: Failure evaluating VMAP/VMAD entry \'", name, "\', vertex index is out of range");
            mFileBuffer += base->dims<<2u;
            continue;
        }
        if (perPoly)    {
            unsigned int polyIdx = ReadVSizedIntLWO2(mFileBuffer) + mCurLayer->mFaceIDXOfs;
            if (base->abAssigned[idx])  {
                // we have already a VMAP entry for this vertex - thus
                // we need to duplicate the corresponding polygon.
                if (polyIdx >= numFaces)    {
                    ASSIMP_LOG_WARN_F("LWO2: Failure evaluating VMAD entry \'", name, "\', polygon index is out of range");
                    mFileBuffer += base->dims<<2u;
                    continue;
                }

                LWO::Face& src = list[polyIdx];

                // generate a new unique vertex for the corresponding index - but only
                // if we can find the index in the face
                bool had = false;
                for (unsigned int i = 0; i < src.mNumIndices;++i)   {

                    unsigned int srcIdx = src.mIndices[i], tmp = idx;
                    do {
                        if (tmp == srcIdx)
                            break;
                    }
                    while ((tmp = refList[tmp]) != UINT_MAX);
                    if (tmp == UINT_MAX) {
                        continue;
                    }

                    had = true;
                    refList.resize(refList.size()+1, UINT_MAX);

                    idx = (unsigned int)pointList.size();
                    src.mIndices[i] = (unsigned int)pointList.size();

                    // store the index of the new vertex in the old vertex
                    // so we get a single linked list we can traverse in
                    // only one direction
                    AddToSingleLinkedList(refList,srcIdx,src.mIndices[i]);
                    pointList.push_back(pointList[srcIdx]);

                    CreateNewEntry(mCurLayer->mVColorChannels,  srcIdx );
                    CreateNewEntry(mCurLayer->mUVChannels,      srcIdx );
                    CreateNewEntry(mCurLayer->mWeightChannels,  srcIdx );
                    CreateNewEntry(mCurLayer->mSWeightChannels, srcIdx );
                    CreateNewEntry(mCurLayer->mNormals, srcIdx );
                }
                if (!had) {
                    ASSIMP_LOG_WARN_F("LWO2: Failure evaluating VMAD entry \'", name, "\', vertex index wasn't found in that polygon");
                    ai_assert(had);
                }
            }
        }

        std::unique_ptr<float[]> temp(new float[type]);
        for (unsigned int l = 0; l < type;++l)
            temp[l] = GetF4();

        DoRecursiveVMAPAssignment(base,type,idx, temp.get());
        mFileBuffer += diff;
    }
}